

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O1

bool flatbuffers::anon_unknown_101::VerifyUnion
               (Verifier *v,Schema *schema,uint8_t utype,uint8_t *elem,Field *union_field)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  char *__function;
  uint uVar4;
  undefined7 in_register_00000011;
  Object *obj;
  Field *pFVar5;
  Schema *pSVar6;
  long lVar7;
  unsigned_short vtsize;
  unsigned_short vtsize_1;
  Schema *pSVar8;
  long lVar9;
  Schema SVar10;
  ushort uVar11;
  
  if ((int)CONCAT71(in_register_00000011,utype) == 0) {
    bVar1 = true;
  }
  else {
    lVar2 = -(long)*(int *)schema;
    if (*(ushort *)(schema + -(long)*(int *)schema) < 7) {
      uVar11 = 0;
    }
    else {
      uVar11 = *(ushort *)(schema + lVar2 + 6);
    }
    if (uVar11 == 0) {
      pSVar8 = (Schema *)0x0;
    }
    else {
      pSVar8 = schema + (ulong)*(uint *)(schema + uVar11) + (ulong)uVar11;
    }
    if (*(ushort *)(union_field + -(long)*(int *)union_field) < 7) {
      uVar11 = 0;
    }
    else {
      uVar11 = *(ushort *)(union_field + (6 - (long)*(int *)union_field));
    }
    if (uVar11 == 0) {
      pFVar5 = (Field *)0x0;
    }
    else {
      pFVar5 = union_field + (ulong)*(uint *)(union_field + uVar11) + (ulong)uVar11;
    }
    if (*(ushort *)(pFVar5 + -(long)*(int *)pFVar5) < 9) {
      uVar11 = 0;
    }
    else {
      uVar11 = *(ushort *)(pFVar5 + (8 - (long)*(int *)pFVar5));
    }
    if (uVar11 == 0) {
      uVar4 = 0xffffffff;
    }
    else {
      uVar4 = *(uint *)(pFVar5 + uVar11);
    }
    if (*(uint *)pSVar8 <= uVar4) {
      __function = 
      "return_type flatbuffers::Vector<flatbuffers::Offset<reflection::Enum>>::Get(SizeT) const [T = flatbuffers::Offset<reflection::Enum>, SizeT = unsigned int]"
      ;
      goto LAB_0014e153;
    }
    lVar7 = (ulong)*(uint *)(pSVar8 + (ulong)(uVar4 << 2) + 4) + (ulong)(uVar4 << 2);
    pSVar6 = pSVar8 + lVar7 + 4;
    lVar9 = -(long)*(int *)pSVar6;
    if (*(ushort *)(pSVar6 + -(long)*(int *)pSVar6) < 7) {
      uVar11 = 0;
    }
    else {
      uVar11 = *(ushort *)(pSVar8 + lVar9 + lVar7 + 10);
    }
    if ((uint)utype < *(uint *)(pSVar6 + (ulong)*(uint *)(pSVar6 + uVar11) + (ulong)uVar11)) {
      if (*(ushort *)(pSVar6 + -(long)*(int *)pSVar6) < 7) {
        uVar11 = 0;
      }
      else {
        uVar11 = *(ushort *)(pSVar8 + lVar9 + lVar7 + 10);
      }
      if (uVar11 == 0) {
        pSVar6 = (Schema *)0x0;
      }
      else {
        pSVar6 = pSVar6 + (ulong)*(uint *)(pSVar6 + uVar11) + (ulong)uVar11;
      }
      uVar4 = (uint)utype;
      if (*(uint *)pSVar6 <= uVar4) {
        __function = 
        "return_type flatbuffers::Vector<flatbuffers::Offset<reflection::EnumVal>>::Get(SizeT) const [T = flatbuffers::Offset<reflection::EnumVal>, SizeT = unsigned int]"
        ;
LAB_0014e153:
        __assert_fail("i < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/vector.h"
                      ,0xc1,__function);
      }
      lVar7 = (ulong)*(uint *)(pSVar6 + (ulong)uVar4 * 4 + 4) + (ulong)uVar4 * 4;
      pSVar8 = pSVar6 + lVar7 + 4;
      if (*(ushort *)(pSVar8 + -(long)*(int *)pSVar8) < 0xb) {
        uVar11 = 0;
      }
      else {
        uVar11 = *(ushort *)(pSVar6 + ((lVar7 + 0xe) - (long)*(int *)pSVar8));
      }
      if (uVar11 == 0) {
        pSVar8 = (Schema *)0x0;
      }
      else {
        pSVar8 = pSVar8 + (ulong)*(uint *)(pSVar8 + uVar11) + (ulong)uVar11;
      }
      lVar7 = -(long)*(int *)pSVar8;
      SVar10.super_Table = (Table)0x0;
      uVar11 = 0;
      if (4 < *(ushort *)(pSVar8 + -(long)*(int *)pSVar8)) {
        uVar11 = *(ushort *)(pSVar8 + lVar7 + 4);
      }
      if (uVar11 != 0) {
        SVar10.super_Table = pSVar8[uVar11].super_Table;
      }
      if (SVar10.super_Table == (Table)0xd) {
        bVar1 = VerifierTemplate<false>::VerifyString(v,(String *)elem);
        return bVar1;
      }
      if (SVar10.super_Table == (Table)0xf) {
        if (*(ushort *)(schema + -(long)*(int *)schema) < 5) {
          uVar11 = 0;
        }
        else {
          uVar11 = *(ushort *)(schema + lVar2 + 4);
        }
        if (uVar11 == 0) {
          pSVar6 = (Schema *)0x0;
        }
        else {
          pSVar6 = schema + (ulong)*(uint *)(schema + uVar11) + (ulong)uVar11;
        }
        if (*(ushort *)(pSVar8 + -(long)*(int *)pSVar8) < 9) {
          uVar11 = 0;
        }
        else {
          uVar11 = *(ushort *)(pSVar8 + lVar7 + 8);
        }
        if (uVar11 == 0) {
          uVar4 = 0xffffffff;
        }
        else {
          uVar4 = *(uint *)(pSVar8 + uVar11);
        }
        if (uVar4 < *(uint *)pSVar6) {
          lVar2 = (ulong)*(uint *)(pSVar6 + (ulong)(uVar4 << 2) + 4) + (ulong)(uVar4 << 2);
          obj = (Object *)(pSVar6 + lVar2 + 4);
          lVar7 = -(long)*(int *)obj;
          if (*(ushort *)(obj + -(long)*(int *)obj) < 9) {
            uVar11 = 0;
          }
          else {
            uVar11 = *(ushort *)(pSVar6 + lVar7 + lVar2 + 0xc);
          }
          if ((uVar11 != 0) && (obj[uVar11].super_Table != (Table)0x0)) {
            if (*(ushort *)(obj + -(long)*(int *)obj) < 0xd) {
              uVar11 = 0;
            }
            else {
              uVar11 = *(ushort *)(pSVar6 + lVar7 + lVar2 + 0x10);
            }
            if (uVar11 == 0) {
              uVar3 = 0;
            }
            else {
              uVar3 = (ulong)*(int *)(obj + uVar11);
            }
            return (ulong)((long)elem - (long)v->buf_) <= v->size_ - uVar3 && uVar3 < v->size_;
          }
          bVar1 = VerifyObject(v,schema,obj,(Table *)elem,true);
          return bVar1;
        }
        __function = 
        "return_type flatbuffers::Vector<flatbuffers::Offset<reflection::Object>>::Get(SizeT) const [T = flatbuffers::Offset<reflection::Object>, SizeT = unsigned int]"
        ;
        goto LAB_0014e153;
      }
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool VerifyUnion(flatbuffers::Verifier &v,
                        const reflection::Schema &schema, uint8_t utype,
                        const uint8_t *elem,
                        const reflection::Field &union_field) {
  if (!utype) return true;  // Not present.
  auto fb_enum = schema.enums()->Get(union_field.type()->index());
  if (utype >= fb_enum->values()->size()) return false;
  auto elem_type = fb_enum->values()->Get(utype)->union_type();
  switch (elem_type->base_type()) {
    case reflection::Obj: {
      auto elem_obj = schema.objects()->Get(elem_type->index());
      if (elem_obj->is_struct()) {
        return v.VerifyFromPointer(elem, elem_obj->bytesize());
      } else {
        return VerifyObject(v, schema, *elem_obj,
                            reinterpret_cast<const flatbuffers::Table *>(elem),
                            true);
      }
    }
    case reflection::String:
      return v.VerifyString(
          reinterpret_cast<const flatbuffers::String *>(elem));
    default: return false;
  }
}